

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O1

void __thiscall
spdlog::details::registry::set_formatter
          (registry *this,
          unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *formatter)

{
  formatter *pfVar1;
  formatter *pfVar2;
  _Hash_node_base *p_Var3;
  logger *this_00;
  int iVar4;
  formatter *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_spdlog::formatter_*,_false> local_28;
  
  local_28._M_head_impl = in_RAX;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar4 == 0) {
    pfVar1 = (formatter->_M_t).
             super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
             super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
             super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
    (formatter->_M_t).
    super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
    super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
    super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = (formatter *)0x0;
    pfVar2 = (this->formatter_)._M_t.
             super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
             super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
             super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
    (this->formatter_)._M_t.
    super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
    super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
    super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = pfVar1;
    if (pfVar2 != (formatter *)0x0) {
      (*pfVar2->_vptr_formatter[1])();
    }
    for (p_Var3 = (this->loggers_)._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
        p_Var3 = p_Var3->_M_nxt) {
      this_00 = (logger *)p_Var3[5]._M_nxt;
      (*((this->formatter_)._M_t.
         super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
         super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
         super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl)->_vptr_formatter[3])
                (&local_28);
      logger::set_formatter
                (this_00,(unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                         &local_28);
      if (local_28._M_head_impl != (formatter *)0x0) {
        (*(local_28._M_head_impl)->_vptr_formatter[1])();
      }
      local_28._M_head_impl = (formatter *)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

SPDLOG_INLINE void registry::set_formatter(std::unique_ptr<formatter> formatter) {
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    formatter_ = std::move(formatter);
    for (auto &l : loggers_) {
        l.second->set_formatter(formatter_->clone());
    }
}